

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::get_codes_to_canonical<int>(Omega_h *this,Int deg,Read<int> *ev2v)

{
  int *piVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  void *extraout_RDX;
  ulong uVar5;
  Alloc *this_00;
  Read<signed_char> RVar6;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_e1;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  Read<int> local_80;
  Read<int> local_70;
  Read<int> local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b0 = *puVar4;
    lStack_a8 = plVar2[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar4;
    local_c0 = (ulong *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,'\x02');
  *(undefined2 *)local_a0 = 0x3939;
  uVar5 = 0xf;
  if (local_c0 != &local_b0) {
    uVar5 = local_b0;
  }
  if (uVar5 < (ulong)(local_98 + local_b8)) {
    uVar5 = 0xf;
    if (local_a0 != local_90) {
      uVar5 = local_90[0];
    }
    if ((ulong)(local_98 + local_b8) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
      goto LAB_001d54c9;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
LAB_001d54c9:
  local_e0 = &local_d0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_d0 = *plVar2;
    uStack_c8 = puVar3[3];
  }
  else {
    local_d0 = *plVar2;
    local_e0 = (long *)*puVar3;
  }
  local_d8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  begin_code("get_codes_to_canonical",(char *)local_e0);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (deg == 2) {
    local_80.write_.shared_alloc_.alloc = (ev2v->write_).shared_alloc_.alloc;
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_80.write_.shared_alloc_.alloc =
             (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_80.write_.shared_alloc_.alloc)->use_count =
             (local_80.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_80.write_.shared_alloc_.direct_ptr = (ev2v->write_).shared_alloc_.direct_ptr;
    get_codes_to_canonical_deg<2,int>(this,&local_80);
    this_00 = local_80.write_.shared_alloc_.alloc;
  }
  else if (deg == 3) {
    local_70.write_.shared_alloc_.alloc = (ev2v->write_).shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc =
             (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_70.write_.shared_alloc_.alloc)->use_count =
             (local_70.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = (ev2v->write_).shared_alloc_.direct_ptr;
    get_codes_to_canonical_deg<3,int>(this,&local_70);
    this_00 = local_70.write_.shared_alloc_.alloc;
  }
  else {
    if (deg != 4) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
           ,0x67);
    }
    local_60.write_.shared_alloc_.alloc = (ev2v->write_).shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.write_.shared_alloc_.alloc)->use_count =
             (local_60.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.write_.shared_alloc_.direct_ptr = (ev2v->write_).shared_alloc_.direct_ptr;
    get_codes_to_canonical_deg<4,int>(this,&local_60);
    this_00 = local_60.write_.shared_alloc_.alloc;
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_e1);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar6.write_.shared_alloc_;
}

Assistant:

Read<I8> get_codes_to_canonical(Int const deg, Read<T> const ev2v) {
  OMEGA_H_TIME_FUNCTION;
  if (deg == 4) return get_codes_to_canonical_deg<4>(ev2v);
  if (deg == 3) return get_codes_to_canonical_deg<3>(ev2v);
  if (deg == 2) return get_codes_to_canonical_deg<2>(ev2v);
  OMEGA_H_NORETURN(Read<I8>());
}